

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  PixelType PVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ArgExc *pAVar5;
  int *piVar6;
  ostream *poVar7;
  LineOrder *pLVar8;
  size_type sVar9;
  value_type pLVar10;
  reference ppLVar11;
  bool *pbVar12;
  long *plVar13;
  long lVar14;
  Compression *pCVar15;
  Compressor *pCVar16;
  Channel *pCVar17;
  char *pcVar18;
  long in_RDI;
  stringstream _iex_throw_s_2;
  ConstIterator i_2;
  ChannelList *c;
  stringstream _iex_throw_s_1;
  int64_t tableSize;
  int64_t imageWidth;
  int64_t imageHeight;
  int i_1;
  size_t i;
  int lineOffsetSize;
  Compressor *compressor;
  Box2i *dataWindow;
  stringstream _iex_throw_s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  const_iterator in_stack_fffffffffffff990;
  long in_stack_fffffffffffff998;
  Array<bool> *in_stack_fffffffffffff9a0;
  size_type in_stack_fffffffffffff9a8;
  LineBuffer *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  Header *in_stack_fffffffffffff9e8;
  size_t in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  Compression c_00;
  stringstream local_518 [16];
  ostream local_508 [376];
  const_iterator local_390;
  const_iterator local_388;
  ChannelList *local_380;
  stringstream local_378 [16];
  ostream local_368 [376];
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  int local_1cc;
  ulong local_1c8;
  int local_1bc;
  Compressor *local_1b8;
  Box2i *local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [408];
  
  c_00 = (Compression)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  Header::type_abi_cxx11_((Header *)0x195384);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff990._M_node,in_stack_fffffffffffff988);
  if (bVar3) {
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar5,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
    __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if (*(int *)(*(long *)(in_RDI + 8) + 0x16c) == -1) {
    bVar3 = isTiled(*(int *)(*(long *)(in_RDI + 8) + 0x60));
    if (bVar3) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar5,"Expected a deep scanline file but the file is tiled.");
      __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    bVar3 = isNonImage(*(int *)(*(long *)(in_RDI + 8) + 0x60));
    if (!bVar3) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar5,"Expected a deep scanline file but the file is not a deep image.");
      __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
  }
  piVar6 = Header::version((Header *)0x195584);
  if (*piVar6 != 1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar7 = std::operator<<(local_198,"Version ");
    piVar6 = Header::version((Header *)0x1955e2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar6);
    std::operator<<(poVar7," not supported for deepscanline images in this version of the library");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar5,local_1a8);
    __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  Header::operator=((Header *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                    (Header *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  pLVar8 = Header::lineOrder((Header *)0x1956e7);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0xd0) = *pLVar8;
  local_1b0 = Header::dataWindow((Header *)0x19571a);
  *(int *)(*(long *)(in_RDI + 8) + 0xd4) = (local_1b0->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xd8) = (local_1b0->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xdc) = (local_1b0->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xe0) = (local_1b0->max).y;
  if ((ulong)((long)((*(int *)(*(long *)(in_RDI + 8) + 0xd8) -
                     *(int *)(*(long *)(in_RDI + 8) + 0xd4)) + 1) *
             (long)((*(int *)(*(long *)(in_RDI + 8) + 0xe0) - *(int *)(*(long *)(in_RDI + 8) + 0xdc)
                    ) + 1)) < 0x10000001) {
    Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
               (long)in_stack_fffffffffffff9a0);
  }
  else {
    *(undefined1 *)(*(long *)(in_RDI + 8) + 0x181) = 1;
  }
  Array<unsigned_int>::resizeErase
            ((Array<unsigned_int> *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  Header::compression((Header *)0x19586d);
  local_1b8 = newCompressor(c_00,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  iVar4 = numLinesInBuffer((Compressor *)in_stack_fffffffffffff990._M_node);
  *(int *)(*(long *)(in_RDI + 8) + 0x168) = iVar4;
  if (local_1b8 != (Compressor *)0x0) {
    (*local_1b8->_vptr_Compressor[1])();
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x104) = *(int *)(*(long *)(in_RDI + 8) + 0xdc) + -1;
  local_1bc = *(int *)(*(long *)(in_RDI + 8) + 0x168);
  local_1bc = (((local_1b0->max).y - (local_1b0->min).y) + local_1bc) / local_1bc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9a8);
  for (local_1c8 = 0; uVar2 = local_1c8,
      sVar9 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x150)), uVar2 < sVar9; local_1c8 = local_1c8 + 1)
  {
    pLVar10 = (value_type)operator_new(0xa0);
    anon_unknown_0::LineBuffer::LineBuffer(in_stack_fffffffffffff9b0);
    ppLVar11 = std::
               vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
               ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                             *)(*(long *)(in_RDI + 8) + 0x150),local_1c8);
    *ppLVar11 = pLVar10;
  }
  Array<bool>::resizeErase(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  for (local_1cc = 0;
      local_1cc <
      (*(int *)(*(long *)(in_RDI + 8) + 0xe0) - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) + 1;
      local_1cc = local_1cc + 1) {
    pbVar12 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
    pbVar12[local_1cc] = false;
  }
  local_1d8 = ((long)*(int *)(*(long *)(in_RDI + 8) + 0xe0) -
              (long)*(int *)(*(long *)(in_RDI + 8) + 0xdc)) + 1;
  local_1e0 = ((long)*(int *)(*(long *)(in_RDI + 8) + 0xd8) -
              (long)*(int *)(*(long *)(in_RDI + 8) + 0xd4)) + 1;
  local_1f0 = (long)*(int *)(*(long *)(in_RDI + 8) + 0x168);
  plVar13 = std::min<long>(&local_1f0,&local_1d8);
  lVar14 = *plVar13 * local_1e0 * 4;
  local_1e8 = lVar14;
  iVar4 = std::numeric_limits<int>::max();
  if (lVar14 <= iVar4) {
    *(undefined4 *)(*(long *)(in_RDI + 8) + 500) = (undefined4)local_1e8;
    Array<char>::resizeErase((Array<char> *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    pCVar15 = Header::compression((Header *)0x195d31);
    pCVar16 = newCompressor((Compression)((ulong)pCVar15 >> 0x20),in_stack_fffffffffffff9f0,
                            in_stack_fffffffffffff9e8);
    *(Compressor **)(*(long *)(in_RDI + 8) + 0x1e8) = pCVar16;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9b0,
               in_stack_fffffffffffff9a8);
    local_380 = Header::channels((Header *)0x195daf);
    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1f0) = 0;
    local_388._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_fffffffffffff988);
    do {
      local_390._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffff988);
      bVar3 = Imf_3_2::operator!=((ConstIterator *)in_stack_fffffffffffff990._M_node,
                                  (ConstIterator *)in_stack_fffffffffffff988);
      if (!bVar3) {
        return;
      }
      pCVar17 = ChannelList::ConstIterator::channel((ConstIterator *)0x195e50);
      PVar1 = pCVar17->type;
      if (PVar1 == UINT) {
        iVar4 = Xdr::size<unsigned_int>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
      }
      else if (PVar1 == HALF) {
        iVar4 = Xdr::size<Imath_3_2::half>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
      }
      else {
        if (PVar1 != FLOAT) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_518);
          poVar7 = std::operator<<(local_508,"Bad type for channel ");
          pcVar18 = ChannelList::ConstIterator::name((ConstIterator *)0x195f45);
          poVar7 = std::operator<<(poVar7,pcVar18);
          std::operator<<(poVar7," initializing deepscanline reader");
          pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar5,local_518);
          __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        iVar4 = Xdr::size<float>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
      }
      in_stack_fffffffffffff990._M_node =
           (_Base_ptr)
           ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffff988,0);
    } while( true );
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_378);
  poVar7 = std::operator<<(local_368,"Deep scanline image size ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1e0);
  poVar7 = std::operator<<(poVar7," x ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1d8);
  std::operator<<(poVar7," exceeds maximum size");
  pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar5,local_378);
  __cxa_throw(pAVar5,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::initialize (const Header& header)
{
    try
    {
        if (header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineInputFile from "
                "a type-mismatched part.");

        if (_data->partNumber == -1)
        {
            if (isTiled (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is tiled.");

            if (!isNonImage (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is not a deep image.");
        }

        if (header.version () != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Version "
                    << header.version ()
                    << " not supported for deepscanline images in this version of the library");
        }

        _data->header = header;

        _data->lineOrder = _data->header.lineOrder ();

        const Box2i& dataWindow = _data->header.dataWindow ();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        if (static_cast<uint64_t> (_data->maxX - _data->minX + 1) *
                static_cast<uint64_t> (_data->maxY - _data->minY + 1) >
            gBigFileDataWindowSize)
        {
            _data->bigFile = true;
        }
        else
        {
            _data->sampleCount.resizeErase (
                _data->maxY - _data->minY + 1, _data->maxX - _data->minX + 1);
        }
        _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

        Compressor* compressor =
            newCompressor (_data->header.compression (), 0, _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize =
            (dataWindow.max.y - dataWindow.min.y + _data->linesInBuffer) /
            _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size (); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase (_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        int64_t imageHeight = static_cast<int64_t>(_data->maxY) - static_cast<int64_t>(_data->minY) + 1;
        int64_t imageWidth = static_cast<int64_t>(_data->maxX) - static_cast<int64_t>(_data->minX) +1;

        int64_t tableSize =  min (static_cast<int64_t>(_data->linesInBuffer), imageHeight) * imageWidth
            * sizeof (unsigned int);

        if (tableSize>std::numeric_limits<int>::max() )
        {
             THROW (IEX_NAMESPACE::ArgExc,
                    "Deep scanline image size "
                    << imageWidth << " x " <<  imageHeight
                    << " exceeds maximum size");
        }
        _data->maxSampleCountTableSize =tableSize;



        _data->sampleCountTableBuffer.resizeErase (
            _data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

        const ChannelList& c = header.channels ();

        _data->combinedSampleSize = 0;
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            switch (i.channel ().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    _data->combinedSampleSize += Xdr::size<half> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    _data->combinedSampleSize += Xdr::size<float> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    _data->combinedSampleSize += Xdr::size<unsigned int> ();
                    break;
                default:
                    THROW (
                        IEX_NAMESPACE::ArgExc,
                        "Bad type for channel "
                            << i.name ()
                            << " initializing deepscanline reader");
            }
        }
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}